

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O0

int __thiscall
cs_impl::any::holder<std::shared_ptr<cs::context_type>_>::kill
          (holder<std::shared_ptr<cs::context_type>_> *this,__pid_t __pid,int __sig)

{
  cs::
  allocator_type<cs_impl::any::holder<std::shared_ptr<cs::context_type>_>,_64UL,_cs_impl::default_allocator_provider>
  ::free((allocator_type<cs_impl::any::holder<std::shared_ptr<cs::context_type>_>,_64UL,_cs_impl::default_allocator_provider>
          *)holder<std::shared_ptr<cs::context_type>>::allocator,this);
  return (int)this;
}

Assistant:

void kill() override
			{
				allocator.free(this);
			}